

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O1

Matrix<double> * __thiscall
nnad::Matrix<double>::GetCofactor
          (Matrix<double> *__return_storage_ptr__,Matrix<double> *this,int p,int q)

{
  ostream *poVar1;
  int iVar2;
  int i;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  if (this->_Lines != this->_Columns) {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"GetCofactor: matrix must be square.","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\x1b[0m",4);
    std::endl<char,std::char_traits<char>>(poVar1);
    exit(-10);
  }
  local_50 = (char *)CONCAT44(local_50._4_4_,this->_Lines + -1);
  local_58 = this->_Columns + -1;
  local_60 = -1;
  Matrix(__return_storage_ptr__,(int *)&local_50,&local_58,&local_60);
  iVar2 = 0;
  local_58 = 0;
  local_60 = 0;
  if (0 < this->_Lines) {
    do {
      local_5c = 0;
      if (0 < this->_Columns) {
        do {
          if ((local_5c != q) && (local_60 != p)) {
            local_54 = iVar2;
            local_50 = (char *)GetElement(this,&local_60,&local_5c);
            SetElement(__return_storage_ptr__,&local_58,&local_54,(double *)&local_50);
            if (iVar2 == this->_Lines + -2) {
              local_58 = local_58 + 1;
              iVar2 = 0;
            }
            else {
              iVar2 = iVar2 + 1;
            }
          }
          local_5c = local_5c + 1;
        } while (local_5c < this->_Columns);
      }
      local_60 = local_60 + 1;
    } while (local_60 < this->_Lines);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T> GetCofactor(int p, int q)
    {
      if (_Lines != _Columns)
        Error("GetCofactor: matrix must be square.");

      Matrix<T> output{_Lines-1, _Columns-1};
      int i = 0, j = 0;

      // Looping for each element of the matrix
      for (int row = 0; row < _Lines; row++)
        for (int col = 0; col < _Columns; col++)
          // Copying into temporary matrix only those element which
          // are not in given row and column.
          if (row != p && col != q)
            {
              output.SetElement(i,j++,  this->GetElement(row,col));

              // Row is filled, so increase row index and reset col
              // index.
              if (j == _Lines - 1)
                {
                  j = 0;
                  i++;
                }
            }
      return output;
    }